

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

ssize_t dma_write(nettlp *nt,uintptr_t addr,void *buf,size_t count)

{
  int iVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  undefined8 local_a0;
  uint64_t dst_addr64;
  char pad [4];
  iovec local_88;
  undefined8 *local_78;
  long local_70;
  uint64_t *local_68;
  long local_60;
  char *local_58;
  long local_50;
  void *local_48;
  size_t local_40;
  char *local_38;
  ulong local_30;
  nettlp_hdr nh;
  
  local_58 = pad;
  pad[0] = '\0';
  pad[1] = '\0';
  pad[2] = '\0';
  pad[3] = '\0';
  local_88.iov_base = &nh;
  nh._0_4_ = 0;
  nh.tstamp._2_2_ = 0;
  local_78 = &local_a0;
  local_88.iov_len = 6;
  local_70 = 8;
  local_50 = 0;
  local_30 = 0;
  uVar8 = (uint)addr;
  if (addr < 0xffffffff) {
    dst_addr64 = CONCAT44(dst_addr64._4_4_,
                          uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                          (uVar8 & 0xfffffffc) << 0x18);
    local_60 = 4;
    bVar7 = 0x40;
  }
  else {
    dst_addr64 = addr >> 0x38 | (addr & 0xff000000000000) >> 0x28 | (addr & 0xff0000000000) >> 0x18
                 | (addr & 0xff00000000) >> 8 | (addr & 0xff000000) << 8 | (addr & 0xff0000) << 0x18
                 | (addr & 0xff00) << 0x28 | (addr & 0xfc) << 0x38;
    local_60 = 8;
    bVar7 = 0x60;
  }
  local_68 = &dst_addr64;
  local_a0._0_4_ = (uint)bVar7;
  local_a0._0_7_ =
       CONCAT16(nt->tag,CONCAT24(nt->requester << 8 | nt->requester >> 8,(uint)local_a0));
  local_a0 = (ulong)(uint7)local_a0;
  local_48 = buf;
  local_40 = count;
  local_38 = local_58;
  iVar1 = tlp_calculate_lstdw(addr,count);
  uVar5 = local_a0;
  uVar6 = ~(0xf << ((byte)count & 0x1f)) & 7;
  if (3 < count) {
    uVar6 = 0xf;
  }
  bVar7 = (byte)addr & 3;
  uVar6 = uVar6 << bVar7;
  local_a0 = CONCAT17((char)iVar1 << 4 | (byte)uVar6 & 0xf,(uint7)local_a0);
  uVar10 = (int)count + uVar8;
  uVar9 = ((short)(uVar10 - (uVar8 & 0x3fffc) >> 2) + 1) - (ushort)((uVar10 & 3) == 0);
  local_a0._0_4_ = CONCAT22(uVar9 * 0x100 | uVar9 >> 8,(short)uVar5);
  if (((uVar6 & 0xf) != 0) && ((uVar6 & 0xf) != 0xf)) {
    local_50 = 0;
    for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
      local_50 = (local_50 + 1) - (ulong)((uVar6 >> (uVar8 & 0x1f) & 1) != 0);
    }
  }
  if ((iVar1 != 0) && (iVar1 != 0xf)) {
    local_30 = (ulong)(uint)(0 << bVar7);
    for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
      local_30 = local_30 + ((iVar1 << ((byte)iVar4 & 0x1f) & 8U) == 0);
    }
  }
  sVar2 = writev(nt->sockfd,&local_88,6);
  uVar8 = (uint)sVar2;
  if ((int)uVar8 < 0) {
    sVar3 = (ssize_t)(int)uVar8;
  }
  else {
    uVar5 = local_70 + local_88.iov_len + local_60;
    if ((uVar8 & 0x7fffffff) < uVar5) {
      sVar3 = -2;
    }
    else {
      sVar3 = (ulong)(uVar8 & 0x7fffffff) - (uVar5 + local_50 + local_30);
    }
  }
  return sVar3;
}

Assistant:

ssize_t dma_write(struct nettlp *nt, uintptr_t addr, void *buf, size_t count)
{
	int ret, n;
	char pad[4] = { 0, 0, 0, 0 };
	struct iovec iov[6];
	struct nettlp_hdr nh;
	struct tlp_mr_hdr mh;
	uint64_t dst_addr64;
	uint32_t dst_addr32;

	memset(&nh, 0, sizeof(nh));
	memset(&mh, 0, sizeof(mh));

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &mh;
	iov[1].iov_len = sizeof(mh);
	iov[3].iov_base = pad;
	iov[3].iov_len = 0;	/* if needed, increment for padding */
	iov[4].iov_base = buf;
	iov[4].iov_len = count;
	iov[5].iov_base = pad;
	iov[5].iov_len = 0;	/* if needed, increment for padding */


	/* build memory write request */
	tlp_set_type(mh.tlp.fmt_type, TLP_TYPE_MWr);
	if (addr < UINT32_MAX) {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_W_DATA);
		dst_addr32 = htobe32(addr & 0xFFFFFFFC);
		iov[2].iov_base = &dst_addr32;
		iov[2].iov_len = sizeof(dst_addr32);
	} else {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_4DW, TLP_FMT_W_DATA);
		dst_addr64 = htobe64(addr & 0xFFFFFFFFFFFFFFFC);
		iov[2].iov_base = &dst_addr64;
		iov[2].iov_len = sizeof(dst_addr64);
	}
	mh.requester = ntohs(nt->requester);
	mh.tag = nt->tag;
	mh.lstdw = tlp_calculate_lstdw(addr, count);
	mh.fstdw = tlp_calculate_fstdw(addr, count);
	tlp_set_length(mh.tlp.falen, tlp_calculate_length(addr, count));

	/* XXX:
	 * 
	 * 1st DW BE is used and not 0xF, move the buffer, if 1st DW
	 * is xx10, x100, or 1000. It needs padding.
	 */
	if (mh.fstdw && mh.fstdw != 0xF) {
		for (n = 0; n < 3; n++) {
			if ((mh.fstdw & (0x1 << n)) == 0) {
				/* this byte is not used. padding! */
				iov[3].iov_len++;
			}
		}
	}

	if (mh.lstdw && mh.lstdw != 0xF) {
		for (n = 0; n < 3; n++) {
			if ((mh.lstdw & (0x8 >> n)) == 0) {
				/* this byte is not used, padding! */
				iov[5].iov_len++;
			}
		}
	}


	ret = writev(nt->sockfd, iov, 6);
	if (ret < 0)
		return ret;

	if (ret < (iov[0].iov_len + iov[1].iov_len + iov[2].iov_len)) {
		/* failed to write the whole packet */
		return -2;
	}

	return ret - (iov[0].iov_len + iov[1].iov_len + iov[2].iov_len
		      + iov[3].iov_len + iov[5].iov_len);
}